

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds03_heap_erase.cpp
# Opt level: O3

void __thiscall
CP::priority_queue<int,_std::less<int>_>::erase(priority_queue<int,_std::less<int>_> *this,int *v)

{
  ulong uVar1;
  int *piVar2;
  int tmp;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t idx;
  
  uVar5 = this->mSize;
  if (uVar5 != 0) {
    idx = 0;
    do {
      piVar2 = this->mData;
      iVar3 = piVar2[idx];
      if (iVar3 == *v) {
        this->mSize = uVar5 - 1;
        iVar3 = piVar2[uVar5 - 1];
        piVar2[idx] = iVar3;
      }
      uVar5 = idx;
      if (idx == 0) {
        uVar5 = 0;
      }
      else {
        do {
          uVar1 = uVar5 - 1;
          uVar4 = uVar1 >> 1;
          if (iVar3 < piVar2[uVar4]) break;
          piVar2[uVar5] = piVar2[uVar4];
          uVar5 = uVar4;
        } while (1 < uVar1);
      }
      piVar2[uVar5] = iVar3;
      fixDown(this,idx);
      idx = idx + 1;
      uVar5 = this->mSize;
    } while (idx < uVar5);
  }
  return;
}

Assistant:

void erase(const T &v) {
        for (int i = 0; i < mSize; ++i) {
            if (mData[i] == v)
                mData[i] = mData[(mSize--) - 1];
            fixUp(i);
            fixDown(i);
        }
    }